

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool kratos::IterVar::safe_to_resize(Var *var,uint32_t target_size,bool is_signed)

{
  IterVar *this;
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  optional<long> value;
  long lStack_c8;
  bool result;
  undefined1 local_c0 [12];
  reference local_b0;
  IterVar **v;
  iterator __end1;
  iterator __begin1;
  vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *__range1;
  queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
  queue;
  undefined1 local_30 [8];
  vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> iters;
  bool is_signed_local;
  uint32_t target_size_local;
  Var *var_local;
  
  iters.super__Vector_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = is_signed;
  iters.super__Vector_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = target_size;
  std::vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::vector
            ((vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *)local_30);
  extract_iter_var(var,(vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *)
                       local_30);
  if (safe_to_resize(kratos::Var_const*,unsigned_int,bool)::sim == '\0') {
    iVar2 = __cxa_guard_acquire(&safe_to_resize(kratos::Var_const*,unsigned_int,bool)::sim);
    if (iVar2 != 0) {
      Simulator::Simulator(&safe_to_resize::sim,(Generator *)0x0);
      __cxa_atexit(Simulator::~Simulator,&safe_to_resize::sim,&__dso_handle);
      __cxa_guard_release(&safe_to_resize(kratos::Var_const*,unsigned_int,bool)::sim);
    }
  }
  std::
  queue<kratos::IterVar_const*,std::deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>>
  ::queue<std::deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>,void>
            ((queue<kratos::IterVar_const*,std::deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>>
              *)&__range1);
  __end1 = std::vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::begin
                     ((vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *)
                      local_30);
  v = (IterVar **)
      std::vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::end
                ((vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *)
                 local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_kratos::IterVar_**,_std::vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
                                *)&v);
    if (!bVar1) break;
    local_b0 = __gnu_cxx::
               __normal_iterator<const_kratos::IterVar_**,_std::vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
               ::operator*(&__end1);
    this = *local_b0;
    iVar3 = max_value(this);
    lStack_c8 = iVar3 + -1;
    std::optional<long>::optional<long,_true>((optional<long> *)local_c0,&stack0xffffffffffffff38);
    value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _12_4_ = 0;
    value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload = (_Storage<long,_true>)local_c0._0_8_;
    value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_c0[8];
    value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_3_
         = local_c0._9_3_;
    Simulator::set_i(&safe_to_resize::sim,&this->super_Var,value,false);
    std::
    queue<kratos::IterVar_const*,std::deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>>
    ::emplace<kratos::IterVar_const*const&>
              ((queue<kratos::IterVar_const*,std::deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>>
                *)&__range1,local_b0);
    __gnu_cxx::
    __normal_iterator<const_kratos::IterVar_**,_std::vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
    ::operator++(&__end1);
  }
  bVar1 = safe_to_resize_(&safe_to_resize::sim,var,
                          iters.
                          super__Vector_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (bool)(iters.
                                 super__Vector_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1),
                          (queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
                           *)&__range1);
  std::
  queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
  ::~queue((queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
            *)&__range1);
  std::vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::~vector
            ((vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *)local_30);
  return bVar1;
}

Assistant:

bool IterVar::safe_to_resize(const Var *var, uint32_t target_size, bool is_signed) {
    std::vector<const IterVar *> iters;
    extract_iter_var(var, iters);
    // brute-force to compute every possible combinations using simulator
    static Simulator sim(nullptr);
    // We did some hacks that, assuming the min and max value is at the boundary
    // maybe use an SMT solver?
    std::queue<const IterVar *> queue;
    for (auto const &v : iters) {
        sim.set_i(v, v->max_value() - 1, false);
        queue.emplace(v);
    }

    auto result = safe_to_resize_(sim, var, target_size, is_signed, queue);

    return result;
}